

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O0

void gc_pose_compose(gc_pose *x1,gc_pose *x2,gc_pose *r)

{
  gc_pose *r_local;
  gc_pose *x2_local;
  gc_pose *x1_local;
  
  if (x1 == (gc_pose *)0x0) {
    __assert_fail("x1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0xd,
                  "void gc_pose_compose(const struct gc_pose *, const struct gc_pose *, struct gc_pose *)"
                 );
  }
  if (x2 == (gc_pose *)0x0) {
    __assert_fail("x2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0xe,
                  "void gc_pose_compose(const struct gc_pose *, const struct gc_pose *, struct gc_pose *)"
                 );
  }
  if (r == (gc_pose *)0x0) {
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0xf,
                  "void gc_pose_compose(const struct gc_pose *, const struct gc_pose *, struct gc_pose *)"
                 );
  }
  if (x1 == r) {
    __assert_fail("x1 != r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x10,
                  "void gc_pose_compose(const struct gc_pose *, const struct gc_pose *, struct gc_pose *)"
                 );
  }
  if (x2 == r) {
    __assert_fail("x2 != r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x11,
                  "void gc_pose_compose(const struct gc_pose *, const struct gc_pose *, struct gc_pose *)"
                 );
  }
  if ((x1->rotation == (matrix3x3 *)0x0) || (x1->translation == (vector3 *)0x0)) {
    __assert_fail("x1->rotation && x1->translation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x12,
                  "void gc_pose_compose(const struct gc_pose *, const struct gc_pose *, struct gc_pose *)"
                 );
  }
  if ((x2->rotation == (matrix3x3 *)0x0) || (x2->translation == (vector3 *)0x0)) {
    __assert_fail("x2->rotation && x2->translation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x13,
                  "void gc_pose_compose(const struct gc_pose *, const struct gc_pose *, struct gc_pose *)"
                 );
  }
  if ((r->rotation != (matrix3x3 *)0x0) && (r->translation != (vector3 *)0x0)) {
    la_dgemm_nnos(3,3,3,(double *)x1->rotation,3,(double *)x2->rotation,3,(double *)r->rotation,3);
    la_dgemv_toe(3,3,1.0,(double *)x2->rotation,3,(double *)x1->translation,1,1.0,
                 (double *)x2->translation,1,(double *)r->translation,1);
    return;
  }
  __assert_fail("r->rotation && r->translation",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x14,
                "void gc_pose_compose(const struct gc_pose *, const struct gc_pose *, struct gc_pose *)"
               );
}

Assistant:

void gc_pose_compose(
        const struct gc_pose *x1,
        const struct gc_pose *x2,
        struct gc_pose *r)
{
    assert(x1);
    assert(x2);
    assert(r);
    assert(x1 != r);
    assert(x2 != r);
    assert(x1->rotation && x1->translation);
    assert(x2->rotation && x2->translation);
    assert(r->rotation && r->translation);

    // E' = E_1 E_2
    la_dgemm_nnos(3, 3, 3,
            (double *)x1->rotation, 3,
            (double *)x2->rotation, 3,
            (double *)r->rotation, 3);

    // r' = r_2 + E_2^T r_1
    la_dgemv_toe(3, 3,
            1.0, (double *)x2->rotation, 3, (double *)x1->translation, 1,
            1.0, (double *)x2->translation, 1,
            (double *)r->translation, 1);
}